

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

int __thiscall mpt::layout::bind(layout *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  item_array<mpt::metatype> *this_00;
  iterator piVar3;
  convertable *this_01;
  char *id;
  undefined4 extraout_var;
  graph *from;
  object *from_00;
  item<mpt::layout::graph> *piVar4;
  socklen_t __len_00;
  undefined4 in_register_00000034;
  char *msg;
  object *o;
  graph *d;
  char *name;
  graph *g;
  metatype *mt;
  item<mpt::metatype> *it;
  iterator __end1;
  iterator __begin1;
  item_array<mpt::metatype> *__range1;
  item_array<mpt::layout::graph> arr;
  undefined1 local_58 [8];
  relation me;
  int ret;
  item_array<mpt::metatype> old;
  logger *out_local;
  relation *rel_local;
  layout *this_local;
  
  old.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref =
       (unique_array<mpt::item<mpt::metatype>_>)(unique_array<mpt::item<mpt::metatype>_>)__addr;
  item_array<mpt::metatype>::item_array
            ((item_array<mpt::metatype> *)&stack0xffffffffffffffd0,&(this->super_item_group)._items)
  ;
  me._28_4_ = 0;
  if (CONCAT44(in_register_00000034,__fd) == 0) {
    __len_00 = 0x2e;
    collection::relation::relation
              ((relation *)local_58,&(this->super_item_group).super_group.super_collection,
               (relation *)0x0,'.');
    me._28_4_ = item_group::bind(&this->super_item_group,(int)local_58,
                                 (sockaddr *)
                                 old.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref,
                                 __len_00);
    collection::relation::~relation((relation *)local_58);
  }
  else {
    me._28_4_ = item_group::bind(&this->super_item_group,__fd,
                                 (sockaddr *)
                                 old.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref,__len);
  }
  if ((int)me._28_4_ < 0) {
    this_local._4_4_ = me._28_4_;
    arr.super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref._0_4_ = 1;
  }
  else {
    item_array<mpt::layout::graph>::item_array((item_array<mpt::layout::graph> *)&__range1,-1);
    this_00 = &(this->super_item_group)._items;
    __end1 = unique_array<mpt::item<mpt::metatype>_>::begin
                       (&this_00->super_unique_array<mpt::item<mpt::metatype>_>);
    piVar3 = unique_array<mpt::item<mpt::metatype>_>::end
                       (&this_00->super_unique_array<mpt::item<mpt::metatype>_>);
    for (; __end1 != piVar3; __end1 = __end1 + 1) {
      this_01 = &reference<mpt::metatype>::instance(&__end1->super_reference<mpt::metatype>)->
                 super_convertable;
      if ((this_01 != (convertable *)0x0) &&
         (name = (char *)convertable::operator_cast_to_graph_(this_01),
         (graph *)name != (graph *)0x0)) {
        id = identifier::name(&__end1->super_identifier);
        iVar2 = (*(((graph *)name)->super_item_group).super_metatype.super_convertable.
                  _vptr_convertable[2])();
        if (CONCAT44(extraout_var,iVar2) == 0) {
          from = convertable::operator_cast_to_graph_(this_01);
          if ((from == (graph *)0x0) ||
             (from_00 = convertable::operator_cast_to_object_(this_01), from_00 == (object *)0x0)) {
            if (old.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref !=
                (reference<mpt::content<mpt::item<mpt::metatype>_>_>)0x0) {
              if ((id == (char *)0x0) || (*id == '\0')) {
                logger::message((logger *)
                                old.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref,
                                "mpt::layout::bind",4,"%s","unable to get graph information");
              }
              else {
                logger::message((logger *)
                                old.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref,
                                "mpt::layout::bind",4,"%s: %s","unable to get graph information",id)
                ;
              }
            }
          }
          else {
            name = (char *)operator_new(0x68);
            graph::graph((graph *)name,from);
            if ((from_00 == (object *)0x0) ||
               (bVar1 = object::set(&((graph *)name)->super_object,from_00,
                                    (logger *)
                                    old.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref),
               bVar1)) goto LAB_0015c9a5;
            (*(((graph *)name)->super_item_group).super_metatype.super_convertable._vptr_convertable
              [1])();
          }
        }
        else {
LAB_0015c9a5:
          piVar4 = item_array<mpt::layout::graph>::append
                             ((item_array<mpt::layout::graph> *)&__range1,(graph *)name,id,-1);
          if (piVar4 == (item<mpt::layout::graph> *)0x0) {
            (**(code **)(*(long *)name + 8))();
            item_array<mpt::metatype>::operator=
                      (&(this->super_item_group)._items,
                       (item_array<mpt::metatype> *)&stack0xffffffffffffffd0);
            this_local._4_4_ = 0;
            goto LAB_0015ca46;
          }
        }
      }
    }
    item_array<mpt::layout::graph>::operator=
              (&this->_graphs,(item_array<mpt::layout::graph> *)&__range1);
    this_local._4_4_ = 1;
LAB_0015ca46:
    arr.super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref._0_4_ = 1;
    item_array<mpt::layout::graph>::~item_array((item_array<mpt::layout::graph> *)&__range1);
  }
  item_array<mpt::metatype>::~item_array((item_array<mpt::metatype> *)&stack0xffffffffffffffd0);
  return this_local._4_4_;
}

Assistant:

int layout::bind(const relation *rel, logger *out)
{
	item_array<metatype> old = _items;
	int ret = 0;
	
	if (!rel) {
		collection::relation me(*this);
		ret = item_group::bind(&me, out);
	} else {
		ret = item_group::bind(rel, out);
	}
	if (ret < 0) {
		return ret;
	}
	item_array<graph> arr;
	
	for (auto &it : _items) {
		metatype *mt;
		graph *g;
		if (!(mt = it.instance()) || !(g = *mt)) {
			continue;
		}
		const char *name = it.name();
		if (!g->addref()) {
			static const char _func[] = "mpt::layout::bind\0";
			::mpt::graph *d;
			object *o = 0;
			if (!(d = *mt) || !(o = *mt)) {
				const char *msg = MPT_tr("unable to get graph information");
				if (out) {
					if (!name || !*name) {
						out->message(_func, out->Warning, "%s", msg);
					} else {
						out->message(_func, out->Warning, "%s: %s", msg, name);
					}
				}
				continue;
			}
			g = new graph(d);
			
			if (o && !g->set(*o, out)) {
				g->unref();
				continue;
			}
		}
		if (!arr.append(g, name)) {
			g->unref();
			_items = old;
			return false;
		}
	}
	_graphs = arr;
	return true;
}